

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polygon.cpp
# Opt level: O1

void __thiscall
vectorgraphics::Polygon2D::Polygon2D
          (Polygon2D *this,vector<double,_std::allocator<double>_> *coordinates)

{
  double dVar1;
  _func_int **pp_Var2;
  pointer pdVar3;
  pointer __args_1;
  long lVar4;
  ulong uVar5;
  undefined1 local_51;
  shared_ptr<vectorgraphics::LineSegment2D> local_50;
  vector<std::shared_ptr<vectorgraphics::LineSegment2D>,std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>>>
  *local_40;
  vector<std::shared_ptr<vectorgraphics::Point2D>,std::allocator<std::shared_ptr<vectorgraphics::Point2D>>>
  *local_38;
  
  local_40 = (vector<std::shared_ptr<vectorgraphics::LineSegment2D>,std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>>>
              *)&this->line_segment_ptrs_;
  local_38 = (vector<std::shared_ptr<vectorgraphics::Point2D>,std::allocator<std::shared_ptr<vectorgraphics::Point2D>>>
              *)&this->point_ptrs_;
  (this->point_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->point_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->line_segment_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::LineSegment2D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->line_segment_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::LineSegment2D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->line_segment_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::LineSegment2D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->point_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar3 = (coordinates->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)(coordinates->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar3)) {
    uVar5 = 1;
    do {
      local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
      (local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count = 1;
      (local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = 1;
      (local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_0010ec68;
      local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)
             (local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi + 1);
      dVar1 = pdVar3[uVar5 - 1];
      pp_Var2 = (_func_int **)(pdVar3 + (uVar5 - 1))[1];
      local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[2]._M_use_count = 0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[2]._M_weak_count = 0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[3]._M_use_count = 0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[3]._M_weak_count = 0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[4]._M_use_count = 0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[4]._M_weak_count = 0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[1]._M_use_count = 0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[1]._M_weak_count = 0;
      local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
      *(double *)
       &local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi[5]._M_use_count = dVar1;
      local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[6]._vptr__Sp_counted_base = pp_Var2;
      std::
      vector<std::shared_ptr<vectorgraphics::Point2D>,std::allocator<std::shared_ptr<vectorgraphics::Point2D>>>
      ::emplace_back<std::shared_ptr<vectorgraphics::Point2D>>
                (local_38,(shared_ptr<vectorgraphics::Point2D> *)&local_50);
      if (local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.
                   super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      pdVar3 = (coordinates->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = uVar5 + 2;
    } while (uVar5 < (ulong)((long)(coordinates->super__Vector_base<double,_std::allocator<double>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pdVar3 >> 3))
    ;
  }
  __args_1 = (this->point_ptrs_).
             super__Vector_base<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = 1;
  if (0x10 < (ulong)((long)(this->point_ptrs_).
                           super__Vector_base<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)__args_1)) {
    lVar4 = 0x10;
    do {
      local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<vectorgraphics::LineSegment2D,std::allocator<vectorgraphics::LineSegment2D>,std::shared_ptr<vectorgraphics::Point2D>&,std::shared_ptr<vectorgraphics::Point2D>&>
                (&local_50.
                  super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(LineSegment2D **)&local_50,
                 (allocator<vectorgraphics::LineSegment2D> *)&local_51,
                 (shared_ptr<vectorgraphics::Point2D> *)
                 ((long)&__args_1[-1].
                         super___shared_ptr<vectorgraphics::Point2D,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + lVar4),
                 (shared_ptr<vectorgraphics::Point2D> *)
                 ((long)&(__args_1->
                         super___shared_ptr<vectorgraphics::Point2D,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr + lVar4));
      std::
      vector<std::shared_ptr<vectorgraphics::LineSegment2D>,std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>>>
      ::emplace_back<std::shared_ptr<vectorgraphics::LineSegment2D>>(local_40,&local_50);
      if (local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.
                   super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      uVar5 = uVar5 + 1;
      __args_1 = (this->point_ptrs_).
                 super__Vector_base<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < (ulong)((long)(this->point_ptrs_).
                                   super__Vector_base<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)__args_1 >> 4)
            );
  }
  local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<vectorgraphics::LineSegment2D,std::allocator<vectorgraphics::LineSegment2D>,std::shared_ptr<vectorgraphics::Point2D>&,std::shared_ptr<vectorgraphics::Point2D>&>
            (&local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(LineSegment2D **)&local_50,
             (allocator<vectorgraphics::LineSegment2D> *)&local_51,__args_1 + (uVar5 - 1),__args_1);
  std::
  vector<std::shared_ptr<vectorgraphics::LineSegment2D>,std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>>>
  ::emplace_back<std::shared_ptr<vectorgraphics::LineSegment2D>>(local_40,&local_50);
  if (local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.
               super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

Polygon2D::Polygon2D(std::vector<double> coordinates) {
    size_t index=0;
    while(index+1 < coordinates.size()) {
      point_ptrs_.push_back(std::make_shared<Point2D>(coordinates[index], coordinates[index+1]));
      index += 2;
    }

    index = 1;
    while(index < point_ptrs_.size()) {
      line_segment_ptrs_.push_back(std::make_shared<LineSegment2D>(point_ptrs_[index-1], point_ptrs_[index]));
      index += 1;
    }
    line_segment_ptrs_.push_back(std::make_shared<LineSegment2D>(point_ptrs_[index-1], point_ptrs_[0]));
  }